

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

bool duckdb::VectorCastHelpers::TryCastLoop<unsigned_long,unsigned_int,duckdb::NumericTryCast>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  bool bVar1;
  CastParameters *in_RDX;
  idx_t in_RSI;
  Vector *in_RDI;
  Vector *unaff_retaddr;
  
  bVar1 = TemplatedTryCastLoop<unsigned_long,unsigned_int,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
                    (unaff_retaddr,in_RDI,in_RSI,in_RDX);
  return bVar1;
}

Assistant:

static bool TryCastLoop(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
		return TemplatedTryCastLoop<SRC, DST, VectorTryCastOperator<OP>>(source, result, count, parameters);
	}